

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc.cpp
# Opt level: O1

void __thiscall spatial_region::pmerging(spatial_region *this,double *ppd,string *pmerging)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  uint uVar6;
  cellp ***pppcVar7;
  cellp *pcVar8;
  particle *ppVar9;
  particle *ppVar10;
  byte bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  undefined8 uVar19;
  int iVar20;
  uint uVar21;
  double *__s;
  double *__s_00;
  double *pdVar22;
  particle **pppVar23;
  ulong uVar24;
  ulong uVar25;
  double *pdVar26;
  int iVar27;
  long lVar28;
  ulong uVar29;
  ulong uVar30;
  double *pdVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  particle *ppVar35;
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  double dVar45;
  double dVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  double local_78;
  long local_70;
  double local_58;
  long local_48;
  
  uVar21 = this->n_ion_populations;
  uVar32 = uVar21 + 3;
  uVar24 = 0xffffffffffffffff;
  if (-4 < (int)uVar21) {
    uVar24 = (long)(int)uVar32 << 3;
  }
  __s = (double *)operator_new__(uVar24);
  __s_00 = (double *)operator_new__(uVar24);
  if (-3 < (int)uVar21) {
    uVar24 = 1;
    if (1 < (int)uVar32) {
      uVar24 = (ulong)uVar32;
    }
    memset(__s,0,uVar24 << 3);
    memset(__s_00,0,uVar24 << 3);
  }
  iVar20 = this->nx;
  if (0 < (long)iVar20) {
    uVar32 = this->ny;
    uVar5 = this->nz;
    pppcVar7 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
               _M_t.super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
               super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
    pdVar22 = this->icmr;
    lVar28 = 0;
    do {
      if (0 < (int)uVar32) {
        uVar24 = 0;
        do {
          if (0 < (int)uVar5) {
            pcVar8 = pppcVar7[lVar28][uVar24];
            uVar30 = 0;
            do {
              for (lVar33 = (long)pcVar8[uVar30].pl.head; lVar33 != 0;
                  lVar33 = *(long *)(lVar33 + 0x58)) {
                dVar45 = *(double *)(lVar33 + 0x40);
                if ((dVar45 != -1.0) || (NAN(dVar45))) {
                  if ((dVar45 != 1.0) || (NAN(dVar45))) {
                    if ((dVar45 != 0.0) || (NAN(dVar45))) {
                      if (0 < (int)uVar21) {
                        uVar25 = 0;
                        do {
                          if ((*(double *)(lVar33 + 0x40) == pdVar22[uVar25]) &&
                             (!NAN(*(double *)(lVar33 + 0x40)) && !NAN(pdVar22[uVar25]))) {
                            __s_00[uVar25 + 3] = *(double *)(lVar33 + 0x38) + __s_00[uVar25 + 3];
                          }
                          uVar25 = uVar25 + 1;
                        } while (uVar21 != uVar25);
                      }
                    }
                    else {
                      __s_00[2] = *(double *)(lVar33 + 0x38) + __s_00[2];
                    }
                  }
                  else {
                    __s_00[1] = *(double *)(lVar33 + 0x38) + __s_00[1];
                  }
                }
                else {
                  *__s_00 = *__s_00 - *(double *)(lVar33 + 0x38);
                }
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar32);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != iVar20);
  }
  iVar20 = std::__cxx11::string::compare((char *)pmerging);
  if (iVar20 == 0) {
    uVar21 = this->nx;
    if (0 < (int)uVar21) {
      auVar36 = ZEXT864(0) << 0x40;
      local_58 = 0.0;
      do {
        if (0 < this->ny) {
          lVar28 = 0;
          do {
            if (0 < this->nz) {
              lVar33 = 0;
              do {
                ppVar9 = (this->cp).p._M_t.
                         super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                         super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                         super__Head_base<0UL,_cellp_***,_false>._M_head_impl[(long)local_58]
                         [lVar28][lVar33].pl.head;
                while (ppVar35 = ppVar9, ppVar35 != (particle *)0x0) {
                  pdVar22 = this->random;
                  iVar20 = this->n_random;
                  iVar27 = iVar20 + 1;
                  dVar45 = pdVar22[iVar20 % 0x37] -
                           pdVar22[iVar20 + 0x1f + ((iVar20 + 0x1f) / 0x37) * -0x37];
                  auVar51._8_8_ = 0;
                  auVar51._0_8_ = dVar45;
                  uVar19 = vcmpsd_avx512f(auVar51,auVar36._0_16_,1);
                  bVar12 = (bool)((byte)uVar19 & 1);
                  dVar45 = (double)((ulong)bVar12 * (long)(dVar45 + 1.0) +
                                   (ulong)!bVar12 * (long)dVar45);
                  pdVar22[iVar20 % 0x37] = dVar45;
                  if (0x36 < iVar20) {
                    iVar27 = 0;
                  }
                  this->n_random = iVar27;
                  ppVar9 = ppVar35->next;
                  if (dVar45 < *ppd) {
                    dVar45 = ppVar35->cmr;
                    if ((dVar45 != -1.0) || (NAN(dVar45))) {
                      if ((dVar45 != 1.0) || (NAN(dVar45))) {
                        if ((dVar45 != 0.0) || (NAN(dVar45))) {
                          iVar20 = this->n_ion_populations;
                          if (0 < (long)iVar20) {
                            pdVar22 = this->icmr;
                            lVar34 = 0;
                            do {
                              if ((ppVar35->cmr == pdVar22[lVar34]) &&
                                 (!NAN(ppVar35->cmr) && !NAN(pdVar22[lVar34]))) {
                                __s[lVar34 + 3] = ppVar35->q + __s[lVar34 + 3];
                              }
                              lVar34 = lVar34 + 1;
                            } while (iVar20 != lVar34);
                          }
                        }
                        else {
                          __s[2] = ppVar35->q + __s[2];
                        }
                      }
                      else {
                        __s[1] = ppVar35->q + __s[1];
                      }
                    }
                    else {
                      *__s = *__s - ppVar35->q;
                    }
                    if (ppVar9 != (particle *)0x0) {
                      ppVar9->previous = ppVar35->previous;
                    }
                    if (ppVar35->previous == (particle *)0x0) {
                      (this->cp).p._M_t.
                      super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                      super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                      super__Head_base<0UL,_cellp_***,_false>._M_head_impl[(long)local_58][lVar28]
                      [lVar33].pl.head = ppVar9;
                      pcVar8 = (this->cp).p._M_t.
                               super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                               super__Head_base<0UL,_cellp_***,_false>._M_head_impl[(long)local_58]
                               [lVar28];
                      pcVar8[lVar33].pl.start = pcVar8[lVar33].pl.head;
                    }
                    else {
                      ppVar35->previous->next = ppVar9;
                    }
                    delete_particle(this,ppVar35,false);
                    auVar36 = ZEXT864(0) << 0x40;
                  }
                }
                lVar33 = lVar33 + 1;
              } while (lVar33 < this->nz);
            }
            lVar28 = lVar28 + 1;
          } while (lVar28 < this->ny);
        }
        local_58 = (double)((long)local_58 + 1);
        uVar21 = this->nx;
      } while ((long)local_58 < (long)(int)uVar21);
    }
    dVar45 = *__s_00 - *__s;
    if ((dVar45 != 0.0) || (NAN(dVar45))) {
      *__s_00 = *__s_00 / dVar45;
    }
    dVar45 = __s_00[1] - __s[1];
    if ((dVar45 != 0.0) || (NAN(dVar45))) {
      __s_00[1] = __s_00[1] / dVar45;
    }
    dVar45 = __s_00[2] - __s[2];
    if ((dVar45 != 0.0) || (NAN(dVar45))) {
      __s_00[2] = __s_00[2] / dVar45;
    }
    uVar32 = this->n_ion_populations;
    if (0 < (int)uVar32) {
      auVar36 = vpbroadcastq_avx512f();
      uVar24 = 0;
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      do {
        auVar38 = vpbroadcastq_avx512f();
        auVar38 = vporq_avx512f(auVar38,auVar37);
        uVar25 = vpcmpuq_avx512f(auVar38,auVar36,2);
        pdVar22 = __s_00 + uVar24 + 3;
        auVar38._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * (long)pdVar22[1];
        auVar38._0_8_ = (ulong)((byte)uVar25 & 1) * (long)*pdVar22;
        auVar38._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * (long)pdVar22[2];
        auVar38._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * (long)pdVar22[3];
        auVar38._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * (long)pdVar22[4];
        auVar38._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * (long)pdVar22[5];
        auVar38._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * (long)pdVar22[6];
        auVar38._56_8_ = (uVar25 >> 7) * (long)pdVar22[7];
        pdVar22 = __s + uVar24 + 3;
        auVar41._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * (long)pdVar22[1];
        auVar41._0_8_ = (ulong)((byte)uVar25 & 1) * (long)*pdVar22;
        auVar41._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * (long)pdVar22[2];
        auVar41._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * (long)pdVar22[3];
        auVar41._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * (long)pdVar22[4];
        auVar41._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * (long)pdVar22[5];
        auVar41._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * (long)pdVar22[6];
        auVar41._56_8_ = (uVar25 >> 7) * (long)pdVar22[7];
        auVar41 = vsubpd_avx512f(auVar38,auVar41);
        uVar30 = vcmppd_avx512f(auVar41,ZEXT1664(ZEXT816(0)),4);
        uVar25 = uVar25 & uVar30;
        auVar38 = vdivpd_avx512f(auVar38,auVar41);
        pdVar22 = __s_00 + uVar24 + 3;
        bVar12 = (bool)((byte)uVar25 & 1);
        bVar13 = (bool)((byte)(uVar25 >> 1) & 1);
        bVar14 = (bool)((byte)(uVar25 >> 2) & 1);
        bVar15 = (bool)((byte)(uVar25 >> 3) & 1);
        bVar16 = (bool)((byte)(uVar25 >> 4) & 1);
        bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
        bVar18 = (bool)((byte)(uVar25 >> 6) & 1);
        *pdVar22 = (double)((ulong)bVar12 * auVar38._0_8_ | (ulong)!bVar12 * (long)*pdVar22);
        pdVar22[1] = (double)((ulong)bVar13 * auVar38._8_8_ | (ulong)!bVar13 * (long)pdVar22[1]);
        pdVar22[2] = (double)((ulong)bVar14 * auVar38._16_8_ | (ulong)!bVar14 * (long)pdVar22[2]);
        pdVar22[3] = (double)((ulong)bVar15 * auVar38._24_8_ | (ulong)!bVar15 * (long)pdVar22[3]);
        pdVar22[4] = (double)((ulong)bVar16 * auVar38._32_8_ | (ulong)!bVar16 * (long)pdVar22[4]);
        pdVar22[5] = (double)((ulong)bVar17 * auVar38._40_8_ | (ulong)!bVar17 * (long)pdVar22[5]);
        pdVar22[6] = (double)((ulong)bVar18 * auVar38._48_8_ | (ulong)!bVar18 * (long)pdVar22[6]);
        pdVar22[7] = (double)((uVar25 >> 7) * auVar38._56_8_ |
                             (ulong)!SUB81(uVar25 >> 7,0) * (long)pdVar22[7]);
        uVar24 = uVar24 + 8;
      } while ((uVar32 + 7 & 0xfffffff8) != uVar24);
    }
    if (0 < (int)uVar21) {
      uVar5 = this->ny;
      uVar6 = this->nz;
      uVar24 = 0;
      do {
        if (0 < (int)uVar5) {
          pppcVar7 = (this->cp).p._M_t.
                     super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                     super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                     super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
          uVar30 = 0;
          do {
            if (0 < (int)uVar6) {
              pcVar8 = pppcVar7[uVar24][uVar30];
              uVar25 = 0;
              do {
                lVar28 = (long)pcVar8[uVar25].pl.head;
                if (lVar28 != 0) {
                  pdVar22 = this->icmr;
                  do {
                    dVar45 = *(double *)(lVar28 + 0x40);
                    if ((((dVar45 == -1.0) && (pdVar31 = __s_00, !NAN(dVar45))) ||
                        ((dVar45 == 1.0 && (pdVar31 = __s_00 + 1, !NAN(dVar45))))) ||
                       ((dVar45 == 0.0 && (pdVar31 = __s_00 + 2, !NAN(dVar45))))) {
                      *(double *)(lVar28 + 0x38) = *pdVar31 * *(double *)(lVar28 + 0x38);
                    }
                    else if (0 < (int)uVar32) {
                      uVar29 = 0;
                      do {
                        if ((dVar45 == pdVar22[uVar29]) && (!NAN(dVar45) && !NAN(pdVar22[uVar29])))
                        {
                          *(double *)(lVar28 + 0x38) =
                               __s_00[uVar29 + 3] * *(double *)(lVar28 + 0x38);
                        }
                        uVar29 = uVar29 + 1;
                      } while (uVar32 != uVar29);
                    }
                    lVar28 = *(long *)(lVar28 + 0x58);
                  } while (lVar28 != 0);
                }
                uVar25 = uVar25 + 1;
              } while (uVar25 != uVar6);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar5);
        }
        uVar24 = uVar24 + 1;
      } while (uVar24 != uVar21);
    }
  }
  else {
    iVar20 = std::__cxx11::string::compare((char *)pmerging);
    if (iVar20 == 0) {
      uVar21 = this->n_ion_populations;
      uVar32 = uVar21 + 3;
      uVar24 = 0xffffffffffffffff;
      if (-4 < (int)uVar21) {
        uVar24 = (long)(int)uVar32 << 3;
      }
      pdVar22 = (double *)operator_new__(uVar24);
      if (-3 < (int)uVar21) {
        uVar24 = 1;
        if (1 < (int)uVar32) {
          uVar24 = (ulong)uVar32;
        }
        memset(pdVar22,0,uVar24 << 3);
      }
      iVar20 = this->nx;
      if (0 < (long)iVar20) {
        uVar5 = this->ny;
        uVar6 = this->nz;
        pppcVar7 = (this->cp).p._M_t.
                   super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                   super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                   super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
        pdVar31 = this->icmr;
        lVar28 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar24 = 0;
            do {
              if (0 < (int)uVar6) {
                pcVar8 = pppcVar7[lVar28][uVar24];
                uVar30 = 0;
                do {
                  for (lVar33 = (long)pcVar8[uVar30].pl.head; lVar33 != 0;
                      lVar33 = *(long *)(lVar33 + 0x58)) {
                    dVar45 = *(double *)(lVar33 + 0x40);
                    if ((((dVar45 == -1.0) && (pdVar26 = pdVar22, !NAN(dVar45))) ||
                        ((dVar45 == 1.0 && (pdVar26 = pdVar22 + 1, !NAN(dVar45))))) ||
                       ((dVar45 == 0.0 && (pdVar26 = pdVar22 + 2, !NAN(dVar45))))) {
                      *pdVar26 = *pdVar26 + 1.0;
                    }
                    else if (0 < (int)uVar21) {
                      uVar25 = 0;
                      do {
                        if ((*(double *)(lVar33 + 0x40) == pdVar31[uVar25]) &&
                           (!NAN(*(double *)(lVar33 + 0x40)) && !NAN(pdVar31[uVar25]))) {
                          pdVar22[uVar25 + 3] = pdVar22[uVar25 + 3] + 1.0;
                        }
                        uVar25 = uVar25 + 1;
                      } while (uVar21 != uVar25);
                    }
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar6);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar5);
          }
          lVar28 = lVar28 + 1;
        } while (lVar28 != iVar20);
      }
      if (-3 < (int)uVar21) {
        uVar21 = 1;
        if (1 < (int)uVar32) {
          uVar21 = uVar32;
        }
        auVar36 = vpbroadcastq_avx512f();
        uVar24 = 0;
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar38 = vpbroadcastq_avx512f();
          auVar38 = vporq_avx512f(auVar38,auVar37);
          uVar30 = vpcmpuq_avx512f(auVar38,auVar36,2);
          pdVar31 = __s_00 + uVar24;
          bVar11 = (byte)uVar30;
          auVar39._8_8_ = (ulong)((byte)(uVar30 >> 1) & 1) * (long)pdVar31[1];
          auVar39._0_8_ = (ulong)(bVar11 & 1) * (long)*pdVar31;
          auVar39._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * (long)pdVar31[2];
          auVar39._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * (long)pdVar31[3];
          auVar39._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * (long)pdVar31[4];
          auVar39._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * (long)pdVar31[5];
          auVar39._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * (long)pdVar31[6];
          auVar39._56_8_ = (uVar30 >> 7) * (long)pdVar31[7];
          pdVar31 = pdVar22 + uVar24;
          auVar40._8_8_ = (ulong)((byte)(uVar30 >> 1) & 1) * (long)pdVar31[1];
          auVar40._0_8_ = (ulong)(bVar11 & 1) * (long)*pdVar31;
          auVar40._16_8_ = (ulong)((byte)(uVar30 >> 2) & 1) * (long)pdVar31[2];
          auVar40._24_8_ = (ulong)((byte)(uVar30 >> 3) & 1) * (long)pdVar31[3];
          auVar40._32_8_ = (ulong)((byte)(uVar30 >> 4) & 1) * (long)pdVar31[4];
          auVar40._40_8_ = (ulong)((byte)(uVar30 >> 5) & 1) * (long)pdVar31[5];
          auVar40._48_8_ = (ulong)((byte)(uVar30 >> 6) & 1) * (long)pdVar31[6];
          auVar40._56_8_ = (uVar30 >> 7) * (long)pdVar31[7];
          auVar41 = vdivpd_avx512f(auVar39,auVar40);
          auVar38 = *(undefined1 (*) [64])(pdVar22 + uVar24);
          auVar42._0_8_ =
               (ulong)(bVar11 & 1) * auVar41._0_8_ | (ulong)!(bool)(bVar11 & 1) * auVar38._0_8_;
          bVar12 = (bool)((byte)(uVar30 >> 1) & 1);
          auVar42._8_8_ = (ulong)bVar12 * auVar41._8_8_ | (ulong)!bVar12 * auVar38._8_8_;
          bVar12 = (bool)((byte)(uVar30 >> 2) & 1);
          auVar42._16_8_ = (ulong)bVar12 * auVar41._16_8_ | (ulong)!bVar12 * auVar38._16_8_;
          bVar12 = (bool)((byte)(uVar30 >> 3) & 1);
          auVar42._24_8_ = (ulong)bVar12 * auVar41._24_8_ | (ulong)!bVar12 * auVar38._24_8_;
          bVar12 = (bool)((byte)(uVar30 >> 4) & 1);
          auVar42._32_8_ = (ulong)bVar12 * auVar41._32_8_ | (ulong)!bVar12 * auVar38._32_8_;
          bVar12 = (bool)((byte)(uVar30 >> 5) & 1);
          auVar42._40_8_ = (ulong)bVar12 * auVar41._40_8_ | (ulong)!bVar12 * auVar38._40_8_;
          bVar12 = (bool)((byte)(uVar30 >> 6) & 1);
          auVar42._48_8_ = (ulong)bVar12 * auVar41._48_8_ | (ulong)!bVar12 * auVar38._48_8_;
          auVar42._56_8_ =
               (uVar30 >> 7) * auVar41._56_8_ | (ulong)!SUB81(uVar30 >> 7,0) * auVar38._56_8_;
          *(undefined1 (*) [64])(pdVar22 + uVar24) = auVar42;
          uVar24 = uVar24 + 8;
        } while ((uVar21 + 7 & 0xfffffff8) != uVar24);
      }
      if (0 < this->nx) {
        auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        auVar37 = ZEXT864(0) << 0x40;
        local_48 = 0;
        do {
          if (0 < this->ny) {
            local_70 = 0;
            do {
              if (0 < this->nz) {
                lVar28 = 0;
                do {
                  ppVar9 = (this->cp).p._M_t.
                           super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                           super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                           super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48][local_70]
                           [lVar28].pl.head;
                  while (ppVar35 = ppVar9, ppVar35 != (particle *)0x0) {
                    ppVar9 = ppVar35->next;
                    dVar45 = ppVar35->cmr;
                    dVar52 = auVar36._0_8_;
                    auVar51 = auVar37._0_16_;
                    if ((dVar45 != -1.0) || (NAN(dVar45))) {
                      if ((dVar45 == dVar52) && (!NAN(dVar45) && !NAN(dVar52))) {
                        pdVar31 = this->random;
                        iVar20 = this->n_random;
                        iVar27 = iVar20 + 1;
                        dVar45 = pdVar31[iVar20 % 0x37] -
                                 pdVar31[iVar20 + 0x1f + ((iVar20 + 0x1f) / 0x37) * -0x37];
                        auVar54._8_8_ = 0;
                        auVar54._0_8_ = dVar45;
                        uVar19 = vcmpsd_avx512f(auVar54,auVar51,1);
                        bVar12 = (bool)((byte)uVar19 & 1);
                        local_58 = (double)((ulong)bVar12 * (long)(dVar45 + dVar52) +
                                           (ulong)!bVar12 * (long)dVar45);
                        pdVar31[iVar20 % 0x37] = local_58;
                        if (0x36 < iVar20) {
                          iVar27 = 0;
                        }
                        this->n_random = iVar27;
                        local_78 = ppd[1];
                        dVar45 = (ppVar35->q + ppVar35->q) / pdVar22[1];
                        goto LAB_00135ea7;
                      }
                      if ((dVar45 == 0.0) && (!NAN(dVar45))) {
                        pdVar31 = this->random;
                        iVar20 = this->n_random;
                        iVar27 = iVar20 + 1;
                        dVar45 = pdVar31[iVar20 % 0x37] -
                                 pdVar31[iVar20 + 0x1f + ((iVar20 + 0x1f) / 0x37) * -0x37];
                        auVar55._8_8_ = 0;
                        auVar55._0_8_ = dVar45;
                        uVar19 = vcmpsd_avx512f(auVar55,auVar51,1);
                        bVar12 = (bool)((byte)uVar19 & 1);
                        local_58 = (double)((ulong)bVar12 * (long)(dVar45 + dVar52) +
                                           (ulong)!bVar12 * (long)dVar45);
                        pdVar31[iVar20 % 0x37] = local_58;
                        if (0x36 < iVar20) {
                          iVar27 = 0;
                        }
                        this->n_random = iVar27;
                        local_78 = ppd[2];
                        dVar45 = (ppVar35->q + ppVar35->q) / pdVar22[2];
                        goto LAB_00135ea7;
                      }
                      if (0 < this->n_ion_populations) {
                        lVar33 = 0;
                        do {
                          if ((ppVar35->cmr == this->icmr[lVar33]) &&
                             (!NAN(ppVar35->cmr) && !NAN(this->icmr[lVar33]))) {
                            pdVar31 = this->random;
                            iVar20 = this->n_random;
                            iVar27 = iVar20 + 1;
                            dVar45 = pdVar31[iVar20 % 0x37] -
                                     pdVar31[iVar20 + 0x1f + ((iVar20 + 0x1f) / 0x37) * -0x37];
                            auVar56._8_8_ = 0;
                            auVar56._0_8_ = dVar45;
                            uVar19 = vcmpsd_avx512f(auVar56,auVar37._0_16_,1);
                            bVar12 = (bool)((byte)uVar19 & 1);
                            dVar45 = (double)((ulong)bVar12 * (long)(dVar45 + auVar36._0_8_) +
                                             (ulong)!bVar12 * (long)dVar45);
                            pdVar31[iVar20 % 0x37] = dVar45;
                            if (0x36 < iVar20) {
                              iVar27 = 0;
                            }
                            this->n_random = iVar27;
                            dVar52 = ppd[lVar33 + 3];
                            dVar46 = pow((ppVar35->q + ppVar35->q) / pdVar22[lVar33 + 3],4.0);
                            auVar37 = ZEXT864(0) << 0x40;
                            auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                            if (dVar45 < (1.0 / (dVar46 + 1.0)) * dVar52) {
                              ppVar10 = ppVar35->next;
                              if (ppVar10 != (particle *)0x0) {
                                ppVar10->previous = ppVar35->previous;
                              }
                              if (ppVar35->previous == (particle *)0x0) {
                                (this->cp).p._M_t.
                                super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>.
                                _M_t.
                                super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                                super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48]
                                [local_70][lVar28].pl.head = ppVar10;
                                pppVar23 = &(this->cp).p._M_t.
                                            super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                            .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                            [local_48][local_70][lVar28].pl.start;
                              }
                              else {
                                pppVar23 = &ppVar35->previous->next;
                              }
                              *pppVar23 = ppVar10;
                              delete_particle(this,ppVar35,false);
                              auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                              auVar37 = ZEXT864(0) << 0x40;
                            }
                          }
                          lVar33 = lVar33 + 1;
                        } while (lVar33 < this->n_ion_populations);
                      }
                    }
                    else {
                      pdVar31 = this->random;
                      iVar20 = this->n_random;
                      iVar27 = iVar20 + 1;
                      dVar45 = pdVar31[iVar20 % 0x37] -
                               pdVar31[iVar20 + 0x1f + ((iVar20 + 0x1f) / 0x37) * -0x37];
                      auVar53._8_8_ = 0;
                      auVar53._0_8_ = dVar45;
                      uVar19 = vcmpsd_avx512f(auVar53,auVar51,1);
                      bVar12 = (bool)((byte)uVar19 & 1);
                      local_58 = (double)((ulong)bVar12 * (long)(dVar45 + dVar52) +
                                         (ulong)!bVar12 * (long)dVar45);
                      pdVar31[iVar20 % 0x37] = local_58;
                      if (0x36 < iVar20) {
                        iVar27 = 0;
                      }
                      this->n_random = iVar27;
                      local_78 = *ppd;
                      dVar45 = (ppVar35->q * -2.0) / *pdVar22;
LAB_00135ea7:
                      dVar45 = pow(dVar45,4.0);
                      auVar37 = ZEXT864(0) << 0x40;
                      auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                      if (local_58 < (1.0 / (dVar45 + 1.0)) * local_78) {
                        ppVar10 = ppVar35->next;
                        if (ppVar10 != (particle *)0x0) {
                          ppVar10->previous = ppVar35->previous;
                        }
                        if (ppVar35->previous == (particle *)0x0) {
                          (this->cp).p._M_t.
                          super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                          super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                          super__Head_base<0UL,_cellp_***,_false>._M_head_impl[local_48][local_70]
                          [lVar28].pl.head = ppVar10;
                          pppVar23 = &(this->cp).p._M_t.
                                      super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                      .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                      [local_48][local_70][lVar28].pl.start;
                        }
                        else {
                          pppVar23 = &ppVar35->previous->next;
                        }
                        *pppVar23 = ppVar10;
                        delete_particle(this,ppVar35,false);
                        auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                        auVar37 = ZEXT864(0) << 0x40;
                      }
                    }
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < this->nz);
              }
              local_70 = local_70 + 1;
            } while (local_70 < this->ny);
          }
          local_48 = local_48 + 1;
        } while (local_48 < this->nx);
      }
      uVar21 = this->nx;
      if (0 < (int)uVar21) {
        local_48 = 0;
        auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
        do {
          if (0 < this->ny) {
            local_70 = 0;
            do {
              if (0 < this->nz) {
                lVar28 = 0;
                do {
                  for (lVar33 = (long)(this->cp).p._M_t.
                                      super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>
                                      ._M_t.
                                      super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>
                                      .super__Head_base<0UL,_cellp_***,_false>._M_head_impl
                                      [local_48][local_70][lVar28].pl.head; lVar33 != 0;
                      lVar33 = *(long *)(lVar33 + 0x58)) {
                    dVar45 = *(double *)(lVar33 + 0x40);
                    if ((dVar45 != -1.0) || (NAN(dVar45))) {
                      if ((dVar45 != auVar36._0_8_) || (NAN(dVar45) || NAN(auVar36._0_8_))) {
                        if ((dVar45 != 0.0) || (NAN(dVar45))) {
                          if (0 < this->n_ion_populations) {
                            lVar34 = 0;
                            do {
                              if ((*(double *)(lVar33 + 0x40) == this->icmr[lVar34]) &&
                                 (!NAN(*(double *)(lVar33 + 0x40)) && !NAN(this->icmr[lVar34]))) {
                                dVar45 = *(double *)(lVar33 + 0x38);
                                dVar52 = ppd[lVar34 + 3];
                                dVar46 = pow((dVar45 + dVar45) / pdVar22[lVar34 + 3],4.0);
                                auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                                auVar50._0_8_ = 1.0 / (dVar46 + 1.0);
                                auVar50._8_8_ = 0;
                                auVar4._8_8_ = 0;
                                auVar4._0_8_ = dVar52;
                                auVar51 = vfnmadd132sd_fma(auVar50,ZEXT816(0x3ff0000000000000),
                                                           auVar4);
                                dVar45 = dVar45 / auVar51._0_8_;
                                *(double *)(lVar33 + 0x38) = dVar45;
                                __s[lVar34 + 3] = dVar45 + __s[lVar34 + 3];
                              }
                              lVar34 = lVar34 + 1;
                            } while (lVar34 < this->n_ion_populations);
                          }
                        }
                        else {
                          dVar45 = *(double *)(lVar33 + 0x38);
                          dVar52 = ppd[2];
                          dVar46 = pow((dVar45 + dVar45) / pdVar22[2],4.0);
                          auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                          auVar49._0_8_ = 1.0 / (dVar46 + 1.0);
                          auVar49._8_8_ = 0;
                          auVar3._8_8_ = 0;
                          auVar3._0_8_ = dVar52;
                          auVar51 = vfnmadd132sd_fma(auVar49,ZEXT816(0x3ff0000000000000),auVar3);
                          dVar45 = dVar45 / auVar51._0_8_;
                          *(double *)(lVar33 + 0x38) = dVar45;
                          __s[2] = dVar45 + __s[2];
                        }
                      }
                      else {
                        dVar45 = *(double *)(lVar33 + 0x38);
                        dVar52 = ppd[1];
                        dVar46 = pow((dVar45 + dVar45) / pdVar22[1],4.0);
                        auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                        auVar48._0_8_ = 1.0 / (dVar46 + 1.0);
                        auVar48._8_8_ = 0;
                        auVar2._8_8_ = 0;
                        auVar2._0_8_ = dVar52;
                        auVar51 = vfnmadd132sd_fma(auVar48,ZEXT816(0x3ff0000000000000),auVar2);
                        dVar45 = dVar45 / auVar51._0_8_;
                        *(double *)(lVar33 + 0x38) = dVar45;
                        __s[1] = dVar45 + __s[1];
                      }
                    }
                    else {
                      dVar45 = *(double *)(lVar33 + 0x38);
                      dVar52 = *ppd;
                      dVar46 = pow((dVar45 * -2.0) / *pdVar22,4.0);
                      auVar36 = ZEXT1664(ZEXT816(0x3ff0000000000000));
                      auVar47._0_8_ = 1.0 / (dVar46 + 1.0);
                      auVar47._8_8_ = 0;
                      auVar1._8_8_ = 0;
                      auVar1._0_8_ = dVar52;
                      auVar51 = vfnmadd132sd_fma(auVar47,ZEXT816(0x3ff0000000000000),auVar1);
                      dVar45 = dVar45 / auVar51._0_8_;
                      *(double *)(lVar33 + 0x38) = dVar45;
                      *__s = *__s - dVar45;
                    }
                  }
                  lVar28 = lVar28 + 1;
                } while (lVar28 < this->nz);
              }
              local_70 = local_70 + 1;
            } while (local_70 < this->ny);
          }
          local_48 = local_48 + 1;
          uVar21 = this->nx;
        } while (local_48 < (int)uVar21);
      }
      uVar32 = this->n_ion_populations;
      if (-3 < (int)uVar32) {
        auVar36 = vpbroadcastq_avx512f();
        uVar24 = 0;
        auVar37 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar38 = vpbroadcastq_avx512f();
          auVar38 = vporq_avx512f(auVar38,auVar37);
          uVar25 = vpcmpuq_avx512f(auVar38,auVar36,2);
          pdVar31 = __s + uVar24;
          auVar43._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * (long)pdVar31[1];
          auVar43._0_8_ = (ulong)((byte)uVar25 & 1) * (long)*pdVar31;
          auVar43._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * (long)pdVar31[2];
          auVar43._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * (long)pdVar31[3];
          auVar43._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * (long)pdVar31[4];
          auVar43._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * (long)pdVar31[5];
          auVar43._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * (long)pdVar31[6];
          auVar43._56_8_ = (uVar25 >> 7) * (long)pdVar31[7];
          uVar30 = vcmppd_avx512f(auVar43,ZEXT864(0) << 0x40,0);
          uVar30 = uVar25 & uVar30;
          pdVar31 = __s_00 + uVar24;
          *pdVar31 = (double)((ulong)!(bool)((byte)uVar30 & 1) * (long)*pdVar31);
          pdVar31[1] = (double)((ulong)!(bool)((byte)(uVar30 >> 1) & 1) * (long)pdVar31[1]);
          pdVar31[2] = (double)((ulong)!(bool)((byte)(uVar30 >> 2) & 1) * (long)pdVar31[2]);
          pdVar31[3] = (double)((ulong)!(bool)((byte)(uVar30 >> 3) & 1) * (long)pdVar31[3]);
          pdVar31[4] = (double)((ulong)!(bool)((byte)(uVar30 >> 4) & 1) * (long)pdVar31[4]);
          pdVar31[5] = (double)((ulong)!(bool)((byte)(uVar30 >> 5) & 1) * (long)pdVar31[5]);
          pdVar31[6] = (double)((ulong)!(bool)((byte)(uVar30 >> 6) & 1) * (long)pdVar31[6]);
          pdVar31[7] = (double)((ulong)!SUB81(uVar30 >> 7,0) * (long)pdVar31[7]);
          uVar30 = vcmppd_avx512f(auVar43,ZEXT864(0) << 0x40,4);
          uVar25 = uVar25 & uVar30;
          pdVar31 = __s_00 + uVar24;
          auVar44._8_8_ = (ulong)((byte)(uVar25 >> 1) & 1) * (long)pdVar31[1];
          auVar44._0_8_ = (ulong)((byte)uVar25 & 1) * (long)*pdVar31;
          auVar44._16_8_ = (ulong)((byte)(uVar25 >> 2) & 1) * (long)pdVar31[2];
          auVar44._24_8_ = (ulong)((byte)(uVar25 >> 3) & 1) * (long)pdVar31[3];
          auVar44._32_8_ = (ulong)((byte)(uVar25 >> 4) & 1) * (long)pdVar31[4];
          auVar44._40_8_ = (ulong)((byte)(uVar25 >> 5) & 1) * (long)pdVar31[5];
          auVar44._48_8_ = (ulong)((byte)(uVar25 >> 6) & 1) * (long)pdVar31[6];
          auVar44._56_8_ = (uVar25 >> 7) * (long)pdVar31[7];
          auVar38 = vdivpd_avx512f(auVar44,auVar43);
          pdVar31 = __s_00 + uVar24;
          bVar12 = (bool)((byte)uVar25 & 1);
          bVar13 = (bool)((byte)(uVar25 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar25 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar25 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar25 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar25 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar25 >> 6) & 1);
          *pdVar31 = (double)((ulong)bVar12 * auVar38._0_8_ | (ulong)!bVar12 * (long)*pdVar31);
          pdVar31[1] = (double)((ulong)bVar13 * auVar38._8_8_ | (ulong)!bVar13 * (long)pdVar31[1]);
          pdVar31[2] = (double)((ulong)bVar14 * auVar38._16_8_ | (ulong)!bVar14 * (long)pdVar31[2]);
          pdVar31[3] = (double)((ulong)bVar15 * auVar38._24_8_ | (ulong)!bVar15 * (long)pdVar31[3]);
          pdVar31[4] = (double)((ulong)bVar16 * auVar38._32_8_ | (ulong)!bVar16 * (long)pdVar31[4]);
          pdVar31[5] = (double)((ulong)bVar17 * auVar38._40_8_ | (ulong)!bVar17 * (long)pdVar31[5]);
          pdVar31[6] = (double)((ulong)bVar18 * auVar38._48_8_ | (ulong)!bVar18 * (long)pdVar31[6]);
          pdVar31[7] = (double)((uVar25 >> 7) * auVar38._56_8_ |
                               (ulong)!SUB81(uVar25 >> 7,0) * (long)pdVar31[7]);
          uVar24 = uVar24 + 8;
        } while ((~((int)(uVar32 + 2) >> 0x1f) & uVar32 + 2 & 0x7ffffff8) + 8 != uVar24);
      }
      if (0 < (int)uVar21) {
        uVar5 = this->ny;
        uVar6 = this->nz;
        uVar24 = 0;
        do {
          if (0 < (int)uVar5) {
            pppcVar7 = (this->cp).p._M_t.
                       super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
                       super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
                       super__Head_base<0UL,_cellp_***,_false>._M_head_impl;
            uVar30 = 0;
            do {
              if (0 < (int)uVar6) {
                pcVar8 = pppcVar7[uVar24][uVar30];
                uVar25 = 0;
                do {
                  lVar28 = (long)pcVar8[uVar25].pl.head;
                  if (lVar28 != 0) {
                    pdVar31 = this->icmr;
                    do {
                      dVar45 = *(double *)(lVar28 + 0x40);
                      if ((((dVar45 == -1.0) && (pdVar26 = __s_00, !NAN(dVar45))) ||
                          ((dVar45 == 1.0 && (pdVar26 = __s_00 + 1, !NAN(dVar45))))) ||
                         ((dVar45 == 0.0 && (pdVar26 = __s_00 + 2, !NAN(dVar45))))) {
                        *(double *)(lVar28 + 0x38) = *pdVar26 * *(double *)(lVar28 + 0x38);
                      }
                      else if (0 < (int)uVar32) {
                        uVar29 = 0;
                        do {
                          if ((dVar45 == pdVar31[uVar29]) && (!NAN(dVar45) && !NAN(pdVar31[uVar29]))
                             ) {
                            *(double *)(lVar28 + 0x38) =
                                 __s_00[uVar29 + 3] * *(double *)(lVar28 + 0x38);
                          }
                          uVar29 = uVar29 + 1;
                        } while (uVar32 != uVar29);
                      }
                      lVar28 = *(long *)(lVar28 + 0x58);
                    } while (lVar28 != 0);
                  }
                  uVar25 = uVar25 + 1;
                } while (uVar25 != uVar6);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar5);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar21);
      }
      operator_delete__(pdVar22);
    }
  }
  operator_delete__(__s);
  operator_delete__(__s_00);
  return;
}

Assistant:

void spatial_region::pmerging(double* ppd, string pmerging)
{
    /* Из-за флуктуаций отношение удаляемого заряда к полному не равно
     * ppd, поэтому для сохранения нейтральности приходится считать
     * это отношение для каждого сорта частиц отдельно и использовать
     * именно его при при увеличении заряда */
    particle* current;
    particle* tmp;
    double* qs = new double[3+n_ion_populations];
    double* a = new double[3+n_ion_populations];
    for (int i=0;i<3+n_ion_populations;i++) {
        qs[i] = 0;
        a[i] = 0;
    }
    for(int i=0;i<nx;i++) {
        for(int j=0;j<ny;j++) {
            for(int k=0;k<nz;k++) {
                current = cp[i][j][k].pl.head;
                while(current!=0) {
                    if (current->cmr==-1)
                        a[0] -= current->q;
                    else if (current->cmr==1)
                        a[1] += current->q;
                    else if (current->cmr==0)
                        a[2] += current->q;
                    else {
                        for (int ii=0;ii<n_ion_populations;ii++) {
                            if (current->cmr==icmr[ii])
                                a[3+ii] += current->q;
                        }
                    }
                    current = current->next;
                }
            }
        }
    }
    if (pmerging=="ti") {
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (get_rand()<ppd[0]) {
                            tmp = current->next;
                            if (current->cmr==-1)
                                qs[0] -= current->q;
                            else if (current->cmr==1)
                                qs[1] += current->q;
                            else if (current->cmr==0)
                                qs[2] += current->q;
                            else {
                                for (int ii=0;ii<n_ion_populations;ii++) {
                                    if (current->cmr==icmr[ii])
                                        qs[3+ii] += current->q;
                                }
                            }
                            //
                            if (current->next!=0)
                                (current->next)->previous = current->previous;
                            //
                            if (current->previous!=0)
                                (current->previous)->next = current->next;
                            else {
                                cp[i][j][k].pl.head = current->next;
                                cp[i][j][k].pl.start = cp[i][j][k].pl.head;
                            }
                            delete_particle(current);
                            //
                            current = tmp;
                        }
                        else
                            current = current->next;
                    }
                }
            }
        }
        //
        if (a[0]-qs[0]!=0)
            a[0] = a[0]/(a[0]-qs[0]);
        if (a[1]-qs[1]!=0)
            a[1] = a[1]/(a[1]-qs[1]);
        if (a[2]-qs[2]!=0)
            a[2] = a[2]/(a[2]-qs[2]);
        for (int i=0;i<n_ion_populations;i++) {
            if (a[3+i]-qs[3+i]!=0)
                a[3+i] = a[3+i]/(a[3+i]-qs[3+i]);
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
    } else if (pmerging=="nl") {
        double* av_q = new double[3+n_ion_populations];
        for(int i=0;i<3+n_ion_populations;i++)
            av_q[i] = 0;
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            av_q[0] += 1;
                        else if (current->cmr==1)
                            av_q[1] += 1;
                        else if (current->cmr==0)
                            av_q[2] += 1;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    av_q[3+ii] += 1;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for (int i=0;i<3+n_ion_populations;i++)
            av_q[i] = a[i]/av_q[i];
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        tmp = current->next;
                        if (current->cmr==-1) {
                            if (get_rand()<ppd[0]*_ppd(-current->q,av_q[0])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==1) {
                            if (get_rand()<ppd[1]*_ppd(current->q,av_q[1])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else if (current->cmr==0) {
                            if (get_rand()<ppd[2]*_ppd(current->q,av_q[2])) {
                                if (current->next!=0)
                                    (current->next)->previous = current->previous;
                                if (current->previous!=0)
                                    (current->previous)->next = current->next;
                                else {
                                    cp[i][j][k].pl.head = current->next;
                                    cp[i][j][k].pl.start = current->next;
                                }
                                delete_particle(current);
                            } 
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    if (get_rand()<ppd[3+ii]*_ppd(current->q,av_q[3+ii])) {
                                        if (current->next!=0)
                                            (current->next)->previous = current->previous;
                                        if (current->previous!=0)
                                            (current->previous)->next = current->next;
                                        else {
                                            cp[i][j][k].pl.head = current->next;
                                            cp[i][j][k].pl.start = current->next;
                                        }
                                        delete_particle(current);
                                    } 
                                }
                            }
                        }
                        current = tmp;
                    }
                }
            }
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1) {
                            current->q = current->q/(1-ppd[0]*_ppd(-current->q,av_q[0]));
                            qs[0] -= current->q;
                        } else if (current->cmr==1) {
                            current->q = current->q/(1-ppd[1]*_ppd(current->q,av_q[1]));
                            qs[1] += current->q;
                        } else if (current->cmr==0) {
                            current->q = current->q/(1-ppd[2]*_ppd(current->q,av_q[2]));
                            qs[2] += current->q;
                        } else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii]) {
                                    current->q = current->q/(1-ppd[3+ii]*_ppd(current->q,av_q[3+ii]));
                                    qs[3+ii] += current->q;
                                }
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        for(int i=0;i<3+n_ion_populations;i++) {
            if (qs[i]!=0)
                a[i] = a[i]/qs[i];
            else
                a[i] = 0;
        }
        for(int i=0;i<nx;i++) {
            for(int j=0;j<ny;j++) {
                for(int k=0;k<nz;k++) {
                    current = cp[i][j][k].pl.head;
                    while(current!=0) {
                        if (current->cmr==-1)
                            current->q = a[0]*current->q;
                        else if (current->cmr==1)
                            current->q = a[1]*current->q;
                        else if (current->cmr==0)
                            current->q = a[2]*current->q;
                        else {
                            for (int ii=0;ii<n_ion_populations;ii++) {
                                if (current->cmr==icmr[ii])
                                    current->q = a[3+ii]*current->q;
                            }
                        }
                        current = current->next;
                    }
                }
            }
        }
        delete[] av_q;
    }
    delete[] qs;
    delete[] a;
}